

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareMultiplierStandardUnit_Test::TestBody(Units_compareMultiplierStandardUnit_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  double dVar4;
  AssertHelper local_120 [8];
  Message local_118 [8];
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  Message local_f8 [8];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  UnitsPtr u2;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr u1;
  Units_compareMultiplierStandardUnit_Test *this_local;
  
  u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"u1",&local_41);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",
             (allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((StandardUnit)peVar2,1,1.0,500.0,(string *)0x0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"u2",&local_b1);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Units::addUnit((StandardUnit)peVar2,1,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  dVar4 = (double)libcellml::Units::scalingFactor
                            ((shared_ptr *)local_20,(shared_ptr *)local_90,true);
  testing::internal::DoubleNearPredFormat
            (local_f0,"0.002","libcellml::Units::scalingFactor(u1, u2)",0.002,dVar4,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x411,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  dVar4 = (double)libcellml::Units::scalingFactor
                            ((shared_ptr *)local_90,(shared_ptr *)local_20,true);
  testing::internal::DoubleNearPredFormat
            (local_110,"500.0","libcellml::Units::scalingFactor(u2, u1)",500.0,dVar4,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x412,pcVar3);
    testing::internal::AssertHelper::operator=(local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(local_120);
    testing::Message::~Message(local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_90);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Units, compareMultiplierStandardUnit)
{
    // u1 = 1000*u2
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::BECQUEREL, 0, 1.0, 500.0);
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::BECQUEREL, 0, 1.0, 1.0);

    EXPECT_NEAR(0.002, libcellml::Units::scalingFactor(u1, u2), 1e-12);
    EXPECT_NEAR(500.0, libcellml::Units::scalingFactor(u2, u1), 1e-12);
}